

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.cpp
# Opt level: O3

unique_ptr<cppcms::crypto::cbc,_std::default_delete<cppcms::crypto::cbc>_> __thiscall
cppcms::crypto::cbc::create(cbc *this,cbc_type type)

{
  openssl_aes_encryptor *this_00;
  pointer *__ptr;
  
  this->_vptr_cbc = (_func_int **)0x0;
  if (type == aes256) {
    this_00 = (openssl_aes_encryptor *)operator_new(0x228);
    openssl_aes_encryptor::openssl_aes_encryptor(this_00,0x100);
  }
  else if (type == aes192) {
    this_00 = (openssl_aes_encryptor *)operator_new(0x228);
    openssl_aes_encryptor::openssl_aes_encryptor(this_00,0xc0);
  }
  else {
    if (type != aes128) {
      return (__uniq_ptr_data<cppcms::crypto::cbc,_std::default_delete<cppcms::crypto::cbc>,_true,_true>
              )(__uniq_ptr_data<cppcms::crypto::cbc,_std::default_delete<cppcms::crypto::cbc>,_true,_true>
                )this;
    }
    this_00 = (openssl_aes_encryptor *)operator_new(0x228);
    openssl_aes_encryptor::openssl_aes_encryptor(this_00,0x80);
  }
  this->_vptr_cbc = (_func_int **)this_00;
  return (__uniq_ptr_data<cppcms::crypto::cbc,_std::default_delete<cppcms::crypto::cbc>,_true,_true>
         )(__uniq_ptr_data<cppcms::crypto::cbc,_std::default_delete<cppcms::crypto::cbc>,_true,_true>
           )this;
}

Assistant:

std::unique_ptr<cbc> cbc::create(cbc::cbc_type type)
{
	std::unique_ptr<cbc> res;
	switch(type) {
#ifdef CPPCMS_HAVE_AES
	case aes128:
		res.reset(new aes_encryption_provider(128));
		break;
	case aes192:
		res.reset(new aes_encryption_provider(192));
		break;
	case aes256:
		res.reset(new aes_encryption_provider(256));
		break;
#endif
	default:
		;
	}
	return res;
}